

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O3

int rtosc_arg_vals_eq_after_abort
              (rtosc_arg_val_itr *litr,rtosc_arg_val_itr *ritr,size_t lsize,size_t rsize)

{
  int32_t iVar1;
  uint uVar2;
  
  if (litr->i != lsize) {
    if (litr->av->type != '-') {
      return 0;
    }
    iVar1 = rtosc_av_rep_num(litr->av);
    if (iVar1 != 0) {
      return 0;
    }
  }
  uVar2 = 1;
  if (ritr->i != rsize) {
    uVar2 = 0;
    if (ritr->av->type == '-') {
      iVar1 = rtosc_av_rep_num(ritr->av);
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

int rtosc_arg_vals_eq_after_abort(const rtosc_arg_val_itr* litr,
                                  const rtosc_arg_val_itr* ritr,
                                  size_t lsize, size_t rsize)
{
    return    (litr->i == lsize ||
                  (litr->av->type == '-' && !rtosc_av_rep_num(litr->av)))
           && (ritr->i == rsize ||
                  (ritr->av->type == '-' && !rtosc_av_rep_num(ritr->av)));
}